

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

Bool inRemovedInfo(uint tid)

{
  int local_14;
  int i;
  uint tid_local;
  
  local_14 = 0;
  while( true ) {
    if (html5Info[local_14].tag == (char *)0x0) {
      return no;
    }
    if (html5Info[local_14].id == tid) break;
    local_14 = local_14 + 1;
  }
  return yes;
}

Assistant:

static Bool inRemovedInfo( uint tid )
{
    int i;
    for (i = 0; ; i++) {
        if (html5Info[i].tag == 0)
            break;
        if (html5Info[i].id == tid)
            return yes;
    }
    return no;
}